

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_StdioFile.cc
# Opt level: O0

void __thiscall Pl_StdioFile::~Pl_StdioFile(Pl_StdioFile *this)

{
  Pl_StdioFile *this_local;
  
  ~Pl_StdioFile(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

Pl_StdioFile::~Pl_StdioFile() = default;